

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

void __thiscall cs_impl::any::holder<cs::lang_error>::~holder(holder<cs::lang_error> *this)

{
  (this->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_0037b0f8;
  std::__cxx11::string::~string((string *)&this->mDat);
  return;
}

Assistant:

~ holder() override = default;